

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# List.h
# Opt level: O0

void __thiscall
JsUtil::
List<void_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_SpecializedComparer<void_*,_JSON::StrictEqualsObjectComparer>::TComparerType>
::EnsureArray(List<void_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_SpecializedComparer<void_*,_JSON::StrictEqualsObjectComparer>::TComparerType>
              *this,int32 requiredCapacity)

{
  void **src;
  bool bVar1;
  int *piVar2;
  Type *ppvVar3;
  Type *oldbuffer;
  Type *newbuffer;
  int32 local_20;
  int32 oldBufferSize;
  int32 newBufferSize;
  int32 newLength;
  int32 newSize;
  int32 requiredCapacity_local;
  List<void_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_SpecializedComparer<void_*,_JSON::StrictEqualsObjectComparer>::TComparerType>
  *this_local;
  
  newLength = requiredCapacity;
  _newSize = this;
  if ((this->
      super_ReadOnlyList<void_*,_Memory::ArenaAllocator,_SpecializedComparer<void_*,_JSON::StrictEqualsObjectComparer>::TComparerType>
      ).buffer == (Type)0x0) {
    piVar2 = max<int>(&newLength,&this->increment);
    newBufferSize = *piVar2;
    ppvVar3 = AllocArray(this,newBufferSize);
    (this->
    super_ReadOnlyList<void_*,_Memory::ArenaAllocator,_SpecializedComparer<void_*,_JSON::StrictEqualsObjectComparer>::TComparerType>
    ).buffer = ppvVar3;
    (this->
    super_ReadOnlyList<void_*,_Memory::ArenaAllocator,_SpecializedComparer<void_*,_JSON::StrictEqualsObjectComparer>::TComparerType>
    ).count = 0;
    this->length = newBufferSize;
  }
  else if (((this->
            super_ReadOnlyList<void_*,_Memory::ArenaAllocator,_SpecializedComparer<void_*,_JSON::StrictEqualsObjectComparer>::TComparerType>
            ).count == this->length) || (this->length < requiredCapacity)) {
    oldBufferSize = 0;
    local_20 = 0;
    newbuffer._4_4_ = 0;
    bVar1 = Int32Math::Add(this->length,1,&oldBufferSize);
    if ((bVar1) || (bVar1 = Int32Math::Shl(oldBufferSize,1,&oldBufferSize), bVar1)) {
      ExternalApi::RaiseOnIntOverflow();
    }
    piVar2 = max<int>(&newLength,&oldBufferSize);
    oldBufferSize = *piVar2;
    bVar1 = Int32Math::Mul(8,oldBufferSize,&local_20);
    if ((bVar1) || (bVar1 = Int32Math::Mul(8,this->length,(int32 *)((long)&newbuffer + 4)), bVar1))
    {
      ExternalApi::RaiseOnIntOverflow();
    }
    ppvVar3 = AllocArray(this,oldBufferSize);
    src = (this->
          super_ReadOnlyList<void_*,_Memory::ArenaAllocator,_SpecializedComparer<void_*,_JSON::StrictEqualsObjectComparer>::TComparerType>
          ).buffer;
    Memory::CopyArray<void*,void*,Memory::ArenaAllocator>
              (ppvVar3,(long)oldBufferSize,src,(long)this->length);
    FreeArray(this,src,newbuffer._4_4_);
    this->length = oldBufferSize;
    (this->
    super_ReadOnlyList<void_*,_Memory::ArenaAllocator,_SpecializedComparer<void_*,_JSON::StrictEqualsObjectComparer>::TComparerType>
    ).buffer = ppvVar3;
  }
  return;
}

Assistant:

void EnsureArray(DECLSPEC_GUARD_OVERFLOW int32 requiredCapacity)
        {
            if (this->buffer == nullptr)
            {
                int32 newSize = max(requiredCapacity, increment);

                this->buffer = AllocArray(newSize);
                this->count = 0;
                this->length = newSize;
            }
            else if (this->count == length || requiredCapacity > this->length)
            {
                int32 newLength = 0, newBufferSize = 0, oldBufferSize = 0;

                if (Int32Math::Add(length, 1u, &newLength)
                    || Int32Math::Shl(newLength, 1u, &newLength))
                {
                    JsUtil::ExternalApi::RaiseOnIntOverflow();
                }

                newLength = max(requiredCapacity, newLength);

                if (Int32Math::Mul(sizeof(T), newLength, &newBufferSize)
                    || Int32Math::Mul(sizeof(T), length, &oldBufferSize))
                {
                    JsUtil::ExternalApi::RaiseOnIntOverflow();
                }

                Field(T, TAllocator)* newbuffer = AllocArray(newLength);
                Field(T, TAllocator)* oldbuffer = this->buffer;
                CopyArray<Field(T, TAllocator), Field(T, TAllocator), EffectiveAllocatorType>(
                    newbuffer, newLength, oldbuffer, length);

                FreeArray(oldbuffer, oldBufferSize);

                this->length = newLength;
                this->buffer = newbuffer;
            }
        }